

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::insert
          (QMovableArrayOps<std::pair<QByteArray,_QByteArray>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  uint uVar1;
  Inserter *in_RCX;
  long lVar2;
  long in_RDX;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *in_RSI;
  pair<QByteArray,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  GrowthPosition pos;
  bool growsAtBegin;
  pair<QByteArray,_QByteArray> copy;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar5;
  Inserter local_60;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0,0x30);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  std::pair<QByteArray,_QByteArray>::pair
            ((pair<QByteArray,_QByteArray> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_RDI);
  bVar3 = (in_RDI->first).d.size != 0;
  uVar4 = bVar3 && in_RSI == (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0;
  uVar5 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffff7c);
  uVar1 = (uint)(bVar3 && in_RSI == (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (pair<QByteArray,_QByteArray> **)CONCAT44(uVar5,uVar1),
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)
             CONCAT17(uVar4,in_stack_ffffffffffffff70));
  if ((uVar5 & 0x1000000) == 0) {
    Inserter::Inserter(in_RCX,(QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)
                              CONCAT44(uVar5,uVar1),CONCAT17(uVar4,in_stack_ffffffffffffff70),
                       (qsizetype)in_RDI);
    Inserter::insertFill
              (in_RCX,(pair<QByteArray,_QByteArray> *)CONCAT44(uVar5,uVar1),
               CONCAT17(uVar4,in_stack_ffffffffffffff70));
    Inserter::~Inserter(&local_60);
  }
  else {
    while (lVar2 = in_RDX + -1, in_RDX != 0) {
      QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::begin
                ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x1a9c29);
      std::pair<QByteArray,_QByteArray>::pair
                ((pair<QByteArray,_QByteArray> *)CONCAT17(uVar4,in_stack_ffffffffffffff70),in_RDI);
      (in_RDI->first).d.ptr = (in_RDI->first).d.ptr + -0x30;
      (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
      in_RDX = lVar2;
    }
  }
  std::pair<QByteArray,_QByteArray>::~pair
            ((pair<QByteArray,_QByteArray> *)CONCAT17(uVar4,in_stack_ffffffffffffff70));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }